

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_coin.cpp
# Opt level: O0

int CfdGetEstimateFee(void *handle,void *fee_handle,char *tx_hex,char *fee_asset,bool is_blind,
                     double effective_fee_rate,int64_t *txout_fee,int64_t *utxo_fee)

{
  bool bVar1;
  undefined8 uVar2;
  int64_t iVar3;
  ElementsTransactionApi *in_RCX;
  char *in_RDX;
  long in_RSI;
  byte in_R8B;
  int64_t *in_R9;
  Amount AVar4;
  int64_t *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  TransactionApi api_1;
  ElementsTransactionApi api;
  Amount utxo_fee_amt;
  Amount tx_fee_amt;
  CfdCapiEstimateFeeData *buffer;
  double in_stack_00000378;
  Amount *in_stack_00000380;
  Amount *in_stack_00000388;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_00000390;
  string *in_stack_00000398;
  TransactionApi *in_stack_000003a0;
  string *in_stack_fffffffffffffcf0;
  CfdError in_stack_fffffffffffffcfc;
  CfdException *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  undefined8 in_stack_fffffffffffffd28;
  undefined1 is_blind_00;
  Amount *in_stack_fffffffffffffd30;
  Amount *in_stack_fffffffffffffd38;
  allocator *paVar5;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_fffffffffffffd48;
  string *tx_hex_00;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda0;
  uint32_t *in_stack_fffffffffffffda8;
  allocator local_219;
  string *in_stack_fffffffffffffde8;
  void *in_stack_fffffffffffffdf0;
  TransactionApi local_1f1;
  int64_t local_1f0;
  undefined1 local_1e8;
  allocator local_1d9;
  string local_1d8;
  ConfidentialAssetId local_1b8;
  allocator local_189;
  string local_188 [39];
  ElementsTransactionApi local_161;
  Amount local_160;
  Amount local_150;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  CfdSourceLocation local_118;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  long local_80;
  allocator local_71;
  string local_70 [48];
  int64_t *local_40;
  byte local_29;
  ElementsTransactionApi *local_28;
  char *local_20;
  long local_18;
  
  is_blind_00 = (undefined1)((ulong)in_stack_fffffffffffffd28 >> 0x38);
  local_29 = in_R8B & 1;
  local_40 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"EstimateFeeData",&local_71);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  if (local_40 == (int64_t *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_coin.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x31c;
    local_98.funcname = "CfdGetEstimateFee";
    cfd::core::logger::warn<>(&local_98,"txout fee is null.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar5 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. txout fee is null.",paVar5);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000008 != (int64_t *)0x0) {
    if (((*(byte *)(local_18 + 0x10) & 1) != 0) &&
       (bVar1 = cfd::capi::IsEmptyString((char *)local_28), bVar1)) {
      local_118.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_coin.cpp"
                   ,0x2f);
      local_118.filename = local_118.filename + 1;
      local_118.line = 0x329;
      local_118.funcname = "CfdGetEstimateFee";
      cfd::core::logger::warn<>(&local_118,"fee asset is empty.");
      local_13a = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"Failed to parameter. fee asset is empty.",&local_139);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0);
      local_13a = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::Amount::Amount(&local_150);
    cfd::core::Amount::Amount(&local_160);
    if ((*(byte *)(local_80 + 0x10) & 1) == 0) {
      cfd::api::TransactionApi::TransactionApi(&local_1f1);
      paVar5 = &local_219;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffde8,local_20,paVar5);
      cfd::api::TransactionApi::EstimateFee
                (in_stack_000003a0,in_stack_00000398,in_stack_00000390,in_stack_00000388,
                 in_stack_00000380,in_stack_00000378);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
    }
    else {
      cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_161);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_188,local_20,&local_189);
      tx_hex_00 = *(string **)(local_80 + 0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d8,(char *)local_28,&local_1d9);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1b8,&local_1d8);
      AVar4 = cfd::api::ElementsTransactionApi::EstimateFee
                        (local_28,tx_hex_00,in_stack_fffffffffffffd48,
                         (ConfidentialAssetId *)
                         CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                         in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,(bool)is_blind_00,
                         (double)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                         in_stack_fffffffffffffd98,in_stack_fffffffffffffda0,
                         in_stack_fffffffffffffda8);
      local_1f0 = AVar4.amount_;
      local_1e8 = AVar4.ignore_check_;
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5c11e2);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
    }
    iVar3 = cfd::core::Amount::GetSatoshiValue(&local_150);
    *local_40 = iVar3;
    iVar3 = cfd::core::Amount::GetSatoshiValue(&local_160);
    *in_stack_00000008 = iVar3;
    return 0;
  }
  local_d8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_coin.cpp"
               ,0x2f);
  local_d8.filename = local_d8.filename + 1;
  local_d8.line = 0x322;
  local_d8.funcname = "CfdGetEstimateFee";
  cfd::core::logger::warn<>(&local_d8,"utxo fee is null.");
  local_fa = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  paVar5 = &local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"Failed to parameter. utxo fee is null.",paVar5);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0);
  local_fa = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetEstimateFee(
    void* handle, void* fee_handle, const char* tx_hex, const char* fee_asset,
    bool is_blind, double effective_fee_rate,
    int64_t* txout_fee, int64_t* utxo_fee) {
  try {
    cfd::Initialize();
    CheckBuffer(fee_handle, kPrefixEstimateFeeData);
    CfdCapiEstimateFeeData* buffer =
        static_cast<CfdCapiEstimateFeeData*>(fee_handle);
    if (txout_fee == nullptr) {
      warn(CFD_LOG_SOURCE, "txout fee is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txout fee is null.");
    }
    if (utxo_fee == nullptr) {
      warn(CFD_LOG_SOURCE, "utxo fee is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. utxo fee is null.");
    }
#ifndef CFD_DISABLE_ELEMENTS
    if (buffer->is_elements && IsEmptyString(fee_asset)) {
      warn(CFD_LOG_SOURCE, "fee asset is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fee asset is empty.");
    }
#else
    info(CFD_LOG_SOURCE, "unuse fee asset[{}]", fee_asset);
#endif  // CFD_DISABLE_ELEMENTS

    Amount tx_fee_amt, utxo_fee_amt;
    if (buffer->is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionApi api;
      api.EstimateFee(
          std::string(tx_hex), *(buffer->input_elements_utxos),
          ConfidentialAssetId(fee_asset), &tx_fee_amt, &utxo_fee_amt, is_blind,
          effective_fee_rate, buffer->exponent, buffer->minimum_bits);
#endif  // CFD_DISABLE_ELEMENTS
    } else {
      TransactionApi api;
      api.EstimateFee(
          std::string(tx_hex), *(buffer->input_utxos), &tx_fee_amt,
          &utxo_fee_amt, effective_fee_rate);
    }
    *txout_fee = tx_fee_amt.GetSatoshiValue();
    *utxo_fee = utxo_fee_amt.GetSatoshiValue();

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}